

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O2

SQObject __thiscall SQCompiler::ExpectScalar(SQCompiler *this)

{
  long lVar1;
  SQObjectType SVar2;
  char *s;
  SQObject SVar3;
  SQObjectValue local_18;
  
  local_18.pTable = (SQTable *)0x0;
  lVar1 = this->_token;
  if (lVar1 - 0x13bU < 2) {
    local_18.nInteger._1_7_ = 0;
    local_18.nInteger._0_1_ = lVar1 == 0x13b;
    SVar2 = OT_BOOL;
    goto LAB_0010f7d3;
  }
  if (lVar1 == 0x2d) {
    Lex(this);
    if (this->_token == 0x105) {
      local_18.fFloat = -(this->_lex)._fvalue;
LAB_0010f7b1:
      local_18.nInteger._4_4_ = 0;
      SVar2 = OT_FLOAT;
      goto LAB_0010f7d3;
    }
    if (this->_token != 0x104) {
      s = "scalar expected : integer, float";
LAB_0010f7c4:
      Error(this,s);
      SVar2 = OT_NULL;
      goto LAB_0010f7d3;
    }
    local_18.nInteger = -(this->_lex)._nvalue;
  }
  else {
    if (lVar1 == 0x103) {
      SVar3 = SQFuncState::CreateString
                        (this->_fs,(this->_lex)._svalue,(this->_lex)._longstr._size - 1);
      local_18 = SVar3._unVal;
      SVar2 = SVar3._type;
      goto LAB_0010f7d3;
    }
    if (lVar1 == 0x105) {
      local_18.fFloat = (this->_lex)._fvalue;
      goto LAB_0010f7b1;
    }
    if (lVar1 != 0x104) {
      s = "scalar expected : integer, float, or string";
      goto LAB_0010f7c4;
    }
    local_18 = (SQObjectValue)(this->_lex)._nvalue;
  }
  SVar2 = OT_INTEGER;
LAB_0010f7d3:
  Lex(this);
  SVar3._4_4_ = 0;
  SVar3._type = SVar2;
  SVar3._unVal.pTable = local_18.pTable;
  return SVar3;
}

Assistant:

SQObject ExpectScalar()
    {
        SQObject val;
        val._type = OT_NULL; val._unVal.nInteger = 0; //shut up GCC 4.x
        switch(_token) {
            case TK_INTEGER:
                val._type = OT_INTEGER;
                val._unVal.nInteger = _lex._nvalue;
                break;
            case TK_FLOAT:
                val._type = OT_FLOAT;
                val._unVal.fFloat = _lex._fvalue;
                break;
            case TK_STRING_LITERAL:
                val = _fs->CreateString(_lex._svalue,_lex._longstr.size()-1);
                break;
            case TK_TRUE:
            case TK_FALSE:
                val._type = OT_BOOL;
                val._unVal.nInteger = _token == TK_TRUE ? 1 : 0;
                break;
            case '-':
                Lex();
                switch(_token)
                {
                case TK_INTEGER:
                    val._type = OT_INTEGER;
                    val._unVal.nInteger = -_lex._nvalue;
                break;
                case TK_FLOAT:
                    val._type = OT_FLOAT;
                    val._unVal.fFloat = -_lex._fvalue;
                break;
                default:
                    Error(_SC("scalar expected : integer, float"));
                }
                break;
            default:
                Error(_SC("scalar expected : integer, float, or string"));
        }
        Lex();
        return val;
    }